

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void delpostest(int i)

{
  void *e;
  void *pvVar1;
  long lVar2;
  
  lVar2 = (long)i;
  e = array[lVar2];
  for (; lVar2 < (long)arraylen + -1; lVar2 = lVar2 + 1) {
    array[lVar2] = array[lVar2 + 1];
  }
  arraylen = (int)((long)arraylen + -1);
  if (tree->cmp == (cmpfn234)0x0) {
    pvVar1 = delpos234(tree,i);
  }
  else {
    pvVar1 = del234(tree,e);
  }
  if (pvVar1 != e) {
    error("del returned %p, expected %p",pvVar1,e);
  }
  verify();
  return;
}

Assistant:

void delpostest(int i)
{
    int index = i;
    void *elem = array[i], *ret;

    /* i points to the right element */
    while (i < arraylen - 1) {
        array[i] = array[i + 1];
        i++;
    }
    arraylen--;                        /* delete elem from array */

    if (tree->cmp)
        ret = del234(tree, elem);
    else
        ret = delpos234(tree, index);

    if (ret != elem) {
        error("del returned %p, expected %p", ret, elem);
    }

    verify();
}